

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

Tag * __thiscall
Mustache::Renderer::findTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,int pos,int endPos)

{
  char16_t cVar1;
  Data *pDVar2;
  int iVar3;
  int endPos_00;
  int iVar4;
  CaseSensitivity pos_00;
  QArrayDataPointer<char16_t> local_48;
  
  iVar3 = QString::indexOf((QString *)content,(longlong)&this->m_tagStartMarker,pos);
  if ((iVar3 == -1 || endPos <= iVar3) ||
     (endPos_00 = QString::indexOf((QString *)content,(longlong)&this->m_tagEndMarker,
                                   iVar3 + (int)(this->m_tagStartMarker).d.size), endPos_00 == -1))
  {
    __return_storage_ptr__->type = Null;
    (__return_storage_ptr__->key).d.d = (Data *)0x0;
    (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->key).d.size = 0;
    __return_storage_ptr__->start = 0;
    __return_storage_ptr__->end = 0;
    __return_storage_ptr__->escapeMode = Escape;
    __return_storage_ptr__->indentation = 0;
    return __return_storage_ptr__;
  }
  iVar4 = (int)(this->m_tagEndMarker).d.size + endPos_00;
  (__return_storage_ptr__->key).d.size = 0;
  __return_storage_ptr__->start = 0;
  __return_storage_ptr__->end = 0;
  (__return_storage_ptr__->key).d.d = (Data *)0x0;
  (__return_storage_ptr__->key).d.ptr = (char16_t *)0x0;
  __return_storage_ptr__->escapeMode = Escape;
  __return_storage_ptr__->indentation = 0;
  __return_storage_ptr__->type = Value;
  __return_storage_ptr__->start = iVar3;
  __return_storage_ptr__->end = iVar4;
  pos_00 = iVar3 + (int)(this->m_tagStartMarker).d.size;
  cVar1 = (content->d).ptr[(int)pos_00];
  if (cVar1 == L'!') {
    __return_storage_ptr__->type = Comment;
LAB_00111d48:
    expandTag(__return_storage_ptr__,content);
  }
  else {
    iVar3 = endPos_00;
    if (cVar1 == L'{') {
      __return_storage_ptr__->escapeMode = Raw;
      pos_00 = pos_00 + CaseSensitive;
      iVar3 = QString::indexOf((QChar)(char16_t)content,0x7d,pos_00);
      if ((long)iVar3 == (long)iVar4 - (this->m_tagEndMarker).d.size) {
        __return_storage_ptr__->end = iVar4 + 1;
        iVar3 = endPos_00;
      }
    }
    else {
      if (cVar1 != L'&') {
        if (cVar1 == L'/') {
          __return_storage_ptr__->type = SectionEnd;
          readTagName((QString *)&local_48,content,pos_00 + CaseSensitive,endPos_00);
        }
        else {
          if (cVar1 == L'=') {
            __return_storage_ptr__->type = SetDelimiter;
            readSetDelimiter(this,content,pos_00 + CaseSensitive,endPos_00);
            goto LAB_00111d48;
          }
          if (cVar1 == L'>') {
            __return_storage_ptr__->type = Partial;
            readTagName((QString *)&local_48,content,pos_00 + CaseSensitive,endPos_00);
          }
          else if (cVar1 == L'^') {
            __return_storage_ptr__->type = InvertedSectionStart;
            readTagName((QString *)&local_48,content,pos_00 + CaseSensitive,endPos_00);
          }
          else {
            if (cVar1 != L'#') goto LAB_00111d5b;
            __return_storage_ptr__->type = SectionStart;
            readTagName((QString *)&local_48,content,pos_00 + CaseSensitive,endPos_00);
          }
        }
        pDVar2 = local_48.d;
        local_48.d = (Data *)0x0;
        (__return_storage_ptr__->key).d.d = pDVar2;
        (__return_storage_ptr__->key).d.ptr = local_48.ptr;
        local_48.ptr = (char16_t *)0x0;
        (__return_storage_ptr__->key).d.size = local_48.size;
        local_48.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        goto LAB_00111d48;
      }
      __return_storage_ptr__->escapeMode = Unescape;
      pos_00 = pos_00 + CaseSensitive;
    }
LAB_00111d5b:
    __return_storage_ptr__->type = Value;
    readTagName((QString *)&local_48,content,pos_00,iVar3);
    pDVar2 = local_48.d;
    local_48.d = (Data *)0x0;
    (__return_storage_ptr__->key).d.d = pDVar2;
    (__return_storage_ptr__->key).d.ptr = local_48.ptr;
    local_48.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->key).d.size = local_48.size;
    local_48.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

Tag Renderer::findTag(const QString& content, int pos, int endPos)
{
	int tagStartPos = content.indexOf(m_tagStartMarker, pos);
	if (tagStartPos == -1 || tagStartPos >= endPos) {
		return Tag();
	}

	int tagEndPos = content.indexOf(m_tagEndMarker, tagStartPos + m_tagStartMarker.length());
	if (tagEndPos == -1) {
		return Tag();
	}
	tagEndPos += m_tagEndMarker.length();

	Tag tag;
	tag.type = Tag::Value;
	tag.start = tagStartPos;
	tag.end = tagEndPos;

	pos = tagStartPos + m_tagStartMarker.length();
	endPos = tagEndPos - m_tagEndMarker.length();

	QChar typeChar = content.at(pos);

	if (typeChar == '#') {
		tag.type = Tag::SectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '^') {
		tag.type = Tag::InvertedSectionStart;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '/') {
		tag.type = Tag::SectionEnd;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '!') {
		tag.type = Tag::Comment;
	} else if (typeChar == '>') {
		tag.type = Tag::Partial;
		tag.key = readTagName(content, pos+1, endPos);
	} else if (typeChar == '=') {
		tag.type = Tag::SetDelimiter;
		readSetDelimiter(content, pos+1, tagEndPos - m_tagEndMarker.length());
	} else {
		if (typeChar == '&') {
			tag.escapeMode = Tag::Unescape;
			++pos;
		} else if (typeChar == '{') {
			tag.escapeMode = Tag::Raw;
			++pos;
			int endTache = content.indexOf('}', pos);
			if (endTache == tag.end - m_tagEndMarker.length()) {
				++tag.end;
			} else {
				endPos = endTache;
			}
		}
		tag.type = Tag::Value;
		tag.key = readTagName(content, pos, endPos);
	}

	if (tag.type != Tag::Value) {
		expandTag(tag, content);
	}

	return tag;
}